

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O0

pair<std::error_code,_unsigned_long> * __thiscall
async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::value
          (Try<std::pair<std::error_code,_unsigned_long>_> *this)

{
  bool bVar1;
  undefined8 uVar2;
  logic_error *this_00;
  pair<std::error_code,_unsigned_long> *ppVar3;
  exception_ptr *in_stack_ffffffffffffffb8;
  exception_ptr this_01;
  exception_ptr local_10 [2];
  
  bVar1 = std::
          holds_alternative<std::pair<std::error_code,unsigned_long>,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                      *)0x2c1fe7);
  if (!bVar1) {
    bVar1 = std::
            holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                        *)0x2c1ffc);
    if (bVar1) {
      std::
      get<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                  *)0x2c200c);
      this_01._M_exception_object = local_10;
      std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)this_01._M_exception_object,in_stack_ffffffffffffffb8);
      uVar2 = std::rethrow_exception(this_01);
      std::__exception_ptr::exception_ptr::~exception_ptr
                ((exception_ptr *)this_01._M_exception_object);
      _Unwind_Resume(uVar2);
    }
    bVar1 = std::
            holds_alternative<std::monostate,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                        *)0x2c204e);
    if (bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Try object is empty");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  ppVar3 = std::
           get<std::pair<std::error_code,unsigned_long>,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                     ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                       *)0x2c20bc);
  return ppVar3;
}

Assistant:

T& value() & {
        checkHasTry();
        return std::get<T>(_value);
    }